

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolBarLayout::setGeometry(ToolBarLayout *this,QRect *rect)

{
  uint uVar1;
  QWidgetItem *pQVar2;
  QLayoutItem *pQVar3;
  long lVar4;
  undefined3 uVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  ulong extraout_RDX;
  long lVar13;
  int iVar14;
  ulong uVar15;
  Orientation OVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  QRect QVar25;
  int local_ac;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  int local_44;
  undefined8 local_40;
  QRect *local_38;
  
  QLayout::setGeometry((QRect *)this);
  auVar24 = QLayout::contentsMargins();
  QVar25 = QRect::adjusted(rect,auVar24._0_4_,auVar24._4_4_,-auVar24._8_4_,-auVar24._12_4_);
  local_68 = QVar25._8_8_;
  if ((((this->buttons).d.size != 0) && (this->left != (QWidgetItem *)0x0)) &&
     (this->right != (QWidgetItem *)0x0)) {
    uVar15 = QVar25._0_8_ >> 0x20;
    if (this->offset < 0) {
      this->offset = 0;
    }
    local_38 = rect;
    uVar8 = (**(code **)(*(long *)this->left + 0x10))();
    iVar10 = (int)((ulong)uVar8 >> 0x20);
    local_60 = (**(code **)(*(long *)this->right + 0x10))();
    iVar14 = QVar25.y1;
    iVar17 = QVar25.x1;
    iVar18 = (int)uVar8;
    if (this->orient == Horizontal) {
      iVar20 = ((QVar25.y2 - iVar14) - iVar10) + 1;
      uVar22 = (ulong)(uint)(iVar20 / 2 + iVar14);
      iVar21 = iVar17;
    }
    else {
      iVar20 = ((QVar25.x2 - iVar17) - iVar18) + 1;
      iVar21 = iVar20 / 2 + iVar17;
      uVar22 = uVar15;
    }
    local_58 = local_60 >> 0x20;
    local_44 = this->offset;
    pQVar2 = this->left;
    if (local_44 < 1) {
      local_88 = 0;
      iStack_84 = 0;
      iStack_80 = -1;
      iStack_7c = -1;
      (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_88,(long)iVar20 % 2 & 0xffffffff);
      uVar8 = 0;
      iVar10 = 0;
      iVar21 = iVar17;
      local_78 = uVar15;
    }
    else {
      iVar20 = (int)uVar22;
      iStack_80 = iVar21 + iVar18 + -1;
      iStack_7c = iVar10 + -1 + iVar20;
      local_88 = iVar21;
      iStack_84 = iVar20;
      (**(code **)(*(long *)pQVar2 + 0x30))();
      OVar16 = this->orient;
      iVar6 = (**(code **)(*(long *)this + 0x60))(this);
      if (OVar16 == Horizontal) {
        iVar21 = iVar21 + iVar18 + iVar6;
        local_78 = uVar22;
      }
      else {
        local_78 = (ulong)(uint)(iVar20 + iVar10 + iVar6);
      }
    }
    local_40 = (**(code **)(*(long *)*(this->buttons).d.ptr + 0x10))();
    iVar20 = (int)((ulong)local_40 >> 0x20);
    iVar18 = iVar20;
    if (this->orient == Horizontal) {
      iVar18 = (int)local_40;
    }
    iVar6 = (**(code **)(*(long *)this + 0x60))(this);
    local_50 = (ulong)(uint)(iVar6 + iVar18);
    uVar22 = 0;
    iVar18 = this->offset;
    while( true ) {
      uVar19 = local_68;
      iVar6 = (int)local_50;
      if (iVar18 < iVar6) break;
      pQVar3 = (this->buttons).d.ptr[uVar22];
      local_88 = 0;
      iStack_84 = 0;
      iStack_80 = -1;
      iStack_7c = -1;
      (**(code **)(*(long *)pQVar3 + 0x30))(pQVar3,&local_88);
      uVar22 = uVar22 + 1;
      iVar18 = iVar18 - iVar6;
    }
    iVar18 = this->offset % iVar6;
    iVar9 = (int)local_68;
    iVar7 = (int)(local_68 >> 0x20);
    if (this->orient == Horizontal) {
      iVar18 = iVar18 + iVar21;
      iVar10 = (iVar9 - ((int)uVar8 + iVar17)) + 1;
      uVar11 = iVar10 - iVar10 % iVar6;
      iVar21 = ((iVar7 - (iVar20 + iVar14)) + 1) / 2 + iVar14;
      local_ac = iVar18;
    }
    else {
      iVar21 = iVar18 + (int)local_78;
      iVar10 = (iVar7 - (iVar10 + iVar14)) + 1;
      uVar11 = iVar10 - iVar10 % iVar6;
      iVar18 = ((iVar9 - (iVar17 + (int)local_40)) + 1) / 2 + iVar17;
      local_ac = iVar21;
    }
    local_78 = (ulong)uVar11;
    iVar10 = spaceNeeded(this);
    OVar16 = this->orient;
    local_70 = uVar19 >> 0x20;
    if (OVar16 == Horizontal) {
      uVar15 = QVar25._0_8_;
    }
    iVar6 = iVar7;
    if (OVar16 == Horizontal) {
      iVar6 = iVar9;
    }
    uVar11 = (iVar6 - (int)uVar15) + 1;
    uVar15 = (ulong)uVar11;
    if (iVar10 < (int)uVar11) {
      uVar1 = (this->align).i;
      uVar5 = (undefined3)(uVar11 >> 8);
      uVar15 = (ulong)CONCAT31(uVar5,OVar16 == Vertical);
      if (((OVar16 == Horizontal & (byte)((uVar1 & 2) >> 1)) == 0) &&
         (bVar12 = OVar16 == Vertical & (byte)((uVar1 & 0x40) >> 6),
         uVar15 = (ulong)CONCAT31(uVar5,bVar12), bVar12 == 0)) {
        if ((uVar1 & 0x84) != 0) {
          if (OVar16 == Horizontal) {
            iVar10 = (iVar9 - (iVar10 + iVar17)) + 1;
            uVar15 = (long)iVar10 % 2 & 0xffffffff;
            iVar18 = iVar10 / 2 + iVar18;
          }
          else {
            iVar10 = (iVar7 - (iVar10 + iVar14)) + 1;
            uVar15 = (long)iVar10 % 2 & 0xffffffff;
            iVar21 = iVar10 / 2 + iVar21;
          }
        }
      }
      else if (OVar16 == Horizontal) {
        iVar18 = ((iVar18 + iVar9) - (iVar10 + iVar17)) + 1;
      }
      else {
        iVar21 = ((iVar21 + iVar7) - (iVar10 + iVar14)) + 1;
      }
    }
    iVar10 = (int)local_40;
    iVar6 = 0;
    while( true ) {
      lVar4 = (this->buttons).d.size;
      if (((int)local_78 <= local_ac) || (lVar4 <= (long)uVar22)) break;
      pQVar3 = (this->buttons).d.ptr[uVar22];
      iStack_80 = iVar10 + -1 + iVar18;
      iStack_7c = iVar20 + -1 + iVar21;
      local_88 = iVar18;
      iStack_84 = iVar21;
      (**(code **)(*(long *)pQVar3 + 0x30))(pQVar3,&local_88);
      OVar16 = this->orient;
      iVar7 = (int)local_50;
      iVar6 = iVar7 + iVar21;
      iVar9 = iVar6;
      if (OVar16 == Horizontal) {
        iVar6 = iVar18 + iVar7;
        iVar9 = iVar21;
        iVar18 = iVar18 + iVar7;
      }
      iVar21 = iVar9;
      local_ac = local_ac + iVar7;
      uVar22 = uVar22 + 1;
      uVar15 = extraout_RDX;
    }
    uVar19 = uVar22 & 0xffffffff;
    if ((long)uVar19 < lVar4) {
      iVar10 = (int)local_68 + 1;
      if (OVar16 == Horizontal) {
        iVar10 = iVar10 - iVar17;
        iVar20 = iVar10 - (int)local_60;
        iVar18 = ((int)local_70 - ((int)local_58 + iVar14)) + 1;
        iVar21 = iVar18 / 2;
      }
      else {
        iVar18 = iVar10 - (iVar17 + (int)local_60);
        iVar20 = iVar18 / 2;
        iVar10 = ((int)local_70 - iVar14) + 1;
        iVar21 = iVar10 - (int)local_58;
      }
      if (iVar10 < local_ac) {
        pQVar3 = (this->buttons).d.ptr[uVar19 - 1];
        local_88 = 0;
        iStack_84 = 0;
        iStack_80 = 0xffffffff;
        iStack_7c = 0xffffffff;
        (**(code **)(*(long *)pQVar3 + 0x30))(pQVar3,&local_88,(long)iVar18 % 2 & 0xffffffff);
      }
      local_88 = iVar20 + iVar17;
      iStack_84 = iVar21 + iVar14;
      iStack_80 = (int)local_60 + -1 + local_88;
      iStack_7c = (int)local_58 + iStack_84 + -1;
      (**(code **)(*(long *)this->right + 0x30))();
      (**(code **)(*(long *)this->right + 0x68))();
      QWidget::raise();
    }
    else {
      local_88 = 0;
      iStack_84 = 0;
      iStack_80 = -1;
      iStack_7c = -1;
      (**(code **)(*(long *)this->right + 0x30))(this->right,&local_88,uVar15);
    }
    lVar13 = (this->buttons).d.size;
    if ((long)uVar19 < lVar13) {
      for (; (long)uVar22 < lVar13; uVar22 = uVar22 + 1) {
        pQVar3 = (this->buttons).d.ptr[uVar22];
        local_88 = 0;
        iStack_84 = 0;
        iStack_80 = -1;
        iStack_7c = -1;
        (**(code **)(*(long *)pQVar3 + 0x30))(pQVar3,&local_88);
        lVar13 = (this->buttons).d.size;
      }
    }
    else if (((lVar4 <= (long)uVar19) && (0 < local_44)) && (0 < this->offset)) {
      uVar15 = (ulong)(uint)((int)local_50 >> 0x1f) << 0x20 | local_50 & 0xffffffff;
      bVar23 = this->orient == Horizontal;
      if (bVar23) {
        iVar14 = iVar17;
      }
      iVar10 = (int)local_70;
      if (bVar23) {
        iVar10 = (int)local_68;
      }
      if (iVar6 + (int)((long)uVar15 / 2) <= (iVar10 - iVar14) + 1) {
        this->offset = 0;
        (**(code **)(*(long *)this + 0xa0))(this,local_38,(long)uVar15 % 2 & 0xffffffff);
      }
    }
    (**(code **)(*(long *)this->left + 0x68))();
    QWidget::raise();
  }
  return;
}

Assistant:

void
ToolBarLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int x = r.x();
	int y = r.y();

	if( !buttons.isEmpty() && left && right )
	{
		if( offset < 0 )
			offset = 0;

		QSize leftSize = left->sizeHint();
		const QSize rightSize = right->sizeHint();

		if( orient == Qt::Horizontal )
			y = r.y() + ( r.height() - leftSize.height() ) / 2;
		else
			x = r.x() + ( r.width() - leftSize.width() ) / 2;

		// Set left arrow geometry.
		bool leftArrowShown = false;

		if( offset > 0 )
		{
			leftArrowShown = true;

			left->setGeometry( QRect( x, y, leftSize.width(), leftSize.height() ) );

			if( orient == Qt::Horizontal )
				x += leftSize.width() + spacing();
			else
				y += leftSize.height() + spacing();
		}
		else
		{
			left->setGeometry( QRect( 0, 0, 0, 0 ) );
			leftSize = QSize( 0, 0 );

			x = r.x();
			y = r.y();
		}

		const QSize buttonSize = buttons.at( 0 )->sizeHint();
		const int dim = ( orient == Qt::Horizontal ?
			buttonSize.width() : buttonSize.height() ) + spacing();
		int i = 0;
		int tmpOffset = offset;

		// Hide buttons that left on left arrow.
		while( tmpOffset >= dim )
		{
			buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );

			++i;
			tmpOffset -= dim;
		}

		int stop = 0;

		// Show visible buttons.
		if( orient == Qt::Horizontal )
		{
			x += offset % dim;
			tmpOffset = x;
			stop = ( r.width() - leftSize.width() ) / dim * dim;
			y = r.y() + ( r.height() - buttonSize.height() ) / 2;
		}
		else
		{
			y += offset % dim;
			tmpOffset = y;
			stop = ( r.height() - leftSize.height() ) / dim * dim;
			x = r.x() + ( r.width() - buttonSize.width() ) / 2;
		}

		int space = spaceNeeded();

		if( space < ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			if( ( ( align & Qt::AlignRight ) && orient == Qt::Horizontal )
				| ( ( align & Qt::AlignBottom ) && orient == Qt::Vertical  ) )
			{
				if( orient == Qt::Horizontal )
					x += r.width() - space;
				else
					y += r.height() - space;
			}
			else if( align & Qt::AlignCenter )
			{
				if( orient == Qt::Horizontal )
					x += ( r.width() - space ) / 2;
				else
					y += ( r.height() - space ) / 2;
			}
		}

		space = 0;

		while( tmpOffset < stop && i < buttons.size() )
		{
			buttons.at( i )->setGeometry( QRect( x, y,
				buttonSize.width(), buttonSize.height() ) );

			if( orient == Qt::Horizontal )
			{
				x += dim;
				space = x;
			}
			else
			{
				y += dim;
				space = y;
			}

			tmpOffset += dim;
			++i;
		}

		// Set right arrow geometry.
		bool rightArrowShown = false;

		if( i < buttons.size() )
		{
			if( orient == Qt::Horizontal )
			{
				x = r.width() - rightSize.width() + r.x();
				y = r.y() + ( r.height() - rightSize.height() ) / 2;

				if( tmpOffset > r.width() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}
			else
			{
				x = r.x() + ( r.width() - rightSize.width() ) / 2;
				y = r.height() - rightSize.height() + r.y();

				if( tmpOffset > r.height() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}

			right->setGeometry( QRect( x, y,
				rightSize.width(), rightSize.height() ) );

			right->widget()->raise();

			rightArrowShown = true;
		}
		else
		{
			right->setGeometry( QRect( 0, 0, 0, 0 ) );
		}

		// Hide buttons that right on right arrow.
		if( i < buttons.size() )
		{
			for( ; i < buttons.size(); ++i )
				buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );
		}
		else if( offset > 0 && leftArrowShown &&
			!rightArrowShown &&
			space + dim / 2 <= ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			offset = 0;
			setGeometry( rect );
		}

		left->widget()->raise();
	}
}